

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_wiznet(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer pwVar7;
  size_t sVar8;
  char *txt;
  int iVar9;
  double dVar10;
  char buf [4608];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    if ((ch->wiznet[0] & 1) == 0) {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      uVar6 = ch->wiznet[0] | 1;
    }
    else {
      send_to_char("Signing off of Wiznet.\n\r",ch);
      uVar6 = ch->wiznet[0] & 0xfffffffffffffffe;
    }
    ch->wiznet[0] = uVar6;
  }
  else {
    bVar2 = str_prefix(argument,"on");
    if (bVar2) {
      bVar2 = str_prefix(argument,"off");
      if (bVar2) {
        bVar2 = str_prefix(argument,"status");
        if (bVar2) {
          bVar2 = str_prefix(argument,"show");
          if (bVar2) {
            lVar5 = wiznet_lookup(argument);
            iVar9 = (int)lVar5;
            if (iVar9 != -1) {
              iVar3 = get_trust(ch);
              if (wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar9].level <= iVar3) {
                iVar3 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar9].flag;
                iVar4 = iVar3 + 0x1f;
                if (-1 < iVar3) {
                  iVar4 = iVar3;
                }
                uVar6 = ch->wiznet[iVar4 >> 5];
                dVar10 = ldexp(1.0,iVar3 % 0x20);
                if ((uVar6 & (long)dVar10) != 0) {
                  sprintf(local_1238,"You will no longer see %s on wiznet.\n\r",
                          wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar9].name);
                  send_to_char(local_1238,ch);
                  dVar10 = ldexp(1.0,wiznet_table.
                                     super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start[iVar9].flag % 0x20);
                  iVar9 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar9].flag;
                  iVar3 = iVar9 + 0x1f;
                  if (-1 < iVar9) {
                    iVar3 = iVar9;
                  }
                  ch->wiznet[iVar3 >> 5] = ch->wiznet[iVar3 >> 5] & ~(long)dVar10;
                  return;
                }
                sprintf(local_1238,"You will now see %s on wiznet.\n\r",
                        wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar9].name);
                send_to_char(local_1238,ch);
                dVar10 = ldexp(1.0,wiznet_table.
                                   super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar9].flag % 0x20);
                iVar9 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar9].flag;
                iVar3 = iVar9 + 0x1f;
                if (-1 < iVar9) {
                  iVar3 = iVar9;
                }
                ch->wiznet[iVar3 >> 5] = ch->wiznet[iVar3 >> 5] | (long)dVar10;
                return;
              }
            }
            send_to_char("No such option.\n\r",ch);
            return;
          }
          local_1238[0] = '\0';
          if ((wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
               super__Vector_impl_data._M_start)->name != (char *)0x0) {
            lVar5 = 0x10;
            pwVar7 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              iVar9 = pwVar7->level;
              iVar3 = get_trust(ch);
              if (iVar9 <= iVar3) {
                strcat(local_1238,
                       *(char **)((long)&wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].name + lVar5)
                      );
                sVar8 = strlen(local_1238);
                (local_1238 + sVar8)[0] = ' ';
                (local_1238 + sVar8)[1] = '\0';
              }
              pwVar7 = (pointer)((long)&(wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->name + lVar5);
              plVar1 = (long *)((long)&(wiznet_table.
                                        super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->name + lVar5);
              lVar5 = lVar5 + 0x10;
            } while (*plVar1 != 0);
          }
          sVar8 = strlen(local_1238);
          (local_1238 + sVar8)[0] = '\n';
          (local_1238 + sVar8)[1] = '\r';
          local_1238[sVar8 + 2] = '\0';
          txt = "Wiznet options available to you are:\n\r";
        }
        else {
          local_1238[0] = '\0';
          if ((ch->wiznet[0] & 1) == 0) {
            sVar8 = strlen(local_1238);
            builtin_strncpy(local_1238 + sVar8,"off ",5);
          }
          if ((wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
               super__Vector_impl_data._M_start)->name != (char *)0x0) {
            lVar5 = 0x10;
            pwVar7 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              iVar9 = pwVar7->flag;
              iVar3 = iVar9 + 0x1f;
              if (-1 < iVar9) {
                iVar3 = iVar9;
              }
              uVar6 = ch->wiznet[iVar3 >> 5];
              dVar10 = ldexp(1.0,iVar9 % 0x20);
              if ((uVar6 & (long)dVar10) != 0) {
                strcat(local_1238,
                       *(char **)((long)&wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].name + lVar5)
                      );
                sVar8 = strlen(local_1238);
                (local_1238 + sVar8)[0] = ' ';
                (local_1238 + sVar8)[1] = '\0';
              }
              pwVar7 = (pointer)((long)&(wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->name + lVar5);
              plVar1 = (long *)((long)&(wiznet_table.
                                        super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->name + lVar5);
              lVar5 = lVar5 + 0x10;
            } while (*plVar1 != 0);
          }
          sVar8 = strlen(local_1238);
          (local_1238 + sVar8)[0] = '\n';
          (local_1238 + sVar8)[1] = '\r';
          local_1238[sVar8 + 2] = '\0';
          txt = "Wiznet status:\n\r";
        }
        send_to_char(txt,ch);
        send_to_char(local_1238,ch);
      }
      else {
        send_to_char("Signing off of Wiznet.\n\r",ch);
        *(byte *)ch->wiznet = (byte)ch->wiznet[0] & 0xfe;
      }
    }
    else {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      *(byte *)ch->wiznet = (byte)ch->wiznet[0] | 1;
    }
  }
  return;
}

Assistant:

void do_wiznet(CHAR_DATA *ch, char *argument)
{
	int flag;
	char buf[MAX_STRING_LENGTH];

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->wiznet, WIZ_ON))
		{
			send_to_char("Signing off of Wiznet.\n\r", ch);
			REMOVE_BIT(ch->wiznet, WIZ_ON);
		}
		else
		{
			send_to_char("Welcome to Wiznet!\n\r", ch);
			SET_BIT(ch->wiznet, WIZ_ON);
		}

		return;
	}

	if (!str_prefix(argument, "on"))
	{
		send_to_char("Welcome to Wiznet!\n\r", ch);
		SET_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	if (!str_prefix(argument, "off"))
	{
		send_to_char("Signing off of Wiznet.\n\r", ch);
		REMOVE_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	/* show wiznet status */
	if (!str_prefix(argument, "status"))
	{
		buf[0] = '\0';

		if (!IS_SET(ch->wiznet, WIZ_ON))
			strcat(buf, "off ");

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet status:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	/* list of all wiznet options */
	if (!str_prefix(argument, "show"))
	{
		buf[0] = '\0';

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (wiznet_table[flag].level <= get_trust(ch))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet options available to you are:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	flag = wiznet_lookup(argument);

	if (flag == -1 || get_trust(ch) < wiznet_table[flag].level)
	{
		send_to_char("No such option.\n\r", ch);
		return;
	}

	if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
	{
		sprintf(buf, "You will no longer see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		REMOVE_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
	else
	{
		sprintf(buf, "You will now see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		SET_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
}